

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example6.cpp
# Opt level: O3

void __thiscall
MyRTPSession::OnRTCPSDESItem
          (MyRTPSession *this,RTPSourceData *srcdat,ItemType t,void *itemdata,size_t itemlength)

{
  size_t __n;
  char msg [1024];
  undefined1 auStack_428 [1024];
  
  memset(auStack_428,0,0x400);
  __n = 0x3ff;
  if (itemlength < 0x3ff) {
    __n = itemlength;
  }
  memcpy(auStack_428,itemdata,__n);
  printf("SSRC %x: Received SDES item (%d): %s",(ulong)srcdat->ssrc,(ulong)t,auStack_428);
  return;
}

Assistant:

void OnRTCPSDESItem(RTPSourceData *srcdat, RTCPSDESPacket::ItemType t, const void *itemdata, size_t itemlength)
	{
		char msg[1024];

		memset(msg, 0, sizeof(msg));
		if (itemlength >= sizeof(msg))
			itemlength = sizeof(msg)-1;

		memcpy(msg, itemdata, itemlength);
		printf("SSRC %x: Received SDES item (%d): %s", (unsigned int)srcdat->GetSSRC(), (int)t, msg);
	}